

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O2

shared_ptr<const_rcg::Image> __thiscall rcg::ImageList::find(ImageList *this,uint64_t timestamp)

{
  __shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<const_rcg::Image> sVar4;
  
  lVar2 = (*(long *)(timestamp + 0x10) - *(long *)(timestamp + 8) >> 4) + 1;
  p_Var3 = (__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)
           (*(long *)(timestamp + 8) + -0x10);
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      this->maxsize = 0;
      (this->list).
      super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      goto LAB_0012f26a;
    }
    p_Var1 = p_Var3 + 1;
    p_Var3 = p_Var3 + 1;
  } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1->_M_ptr->timestamp != in_RDX._M_pi
          );
  std::__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
  in_RDX._M_pi = extraout_RDX;
LAB_0012f26a:
  sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_rcg::Image>)
         sVar4.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp) const
{
  for (size_t i=0; i<list.size(); i++)
  {
    if (list[i]->getTimestampNS() == timestamp)
    {
      return list[i];
    }
  }

  return std::shared_ptr<const Image>();
}